

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H31_traverse.c
# Opt level: O3

pbtree pop_stack(pbtreestack s)

{
  pbtree pbVar1;
  pbtree *ppbVar2;
  
  ppbVar2 = s->top;
  if (ppbVar2 == s->base) {
    printf("Error");
    ppbVar2 = s->top;
  }
  pbVar1 = *ppbVar2;
  s->top = ppbVar2 + -1;
  return pbVar1;
}

Assistant:

pbtree pop_stack(pbtreestack s) {
  if (s->top == s->base) {
    printf("Error");
  }
  pbtree e = *(s->top);
  s->top--;
  return e;
  // return *(--(s->top));
}